

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O2

XMLNode __thiscall XMLParser::XMLNode::getChildNode(XMLNode *this,char *name,int j)

{
  long lVar1;
  int iVar2;
  int in_ECX;
  undefined4 in_register_00000014;
  int *j_00;
  long lVar3;
  int i;
  XMLNode local_38;
  
  j_00 = (int *)CONCAT44(in_register_00000014,j);
  lVar1 = *(long *)name;
  if (lVar1 != 0) {
    if (-1 < in_ECX) {
      for (; 0 < in_ECX; in_ECX = in_ECX + -1) {
        getChildNode(&local_38,name,j_00);
        ~XMLNode(&local_38);
      }
      getChildNode(this,name,j_00);
      return (XMLNode)(XMLNodeData *)this;
    }
    lVar3 = (long)*(int *)(lVar1 + 8) + 1;
    do {
      if (lVar3 == 1) goto LAB_0017bdd9;
      iVar2 = strcasecmp((char *)j_00,
                         (char *)**(undefined8 **)(*(long *)(lVar1 + 0x28) + -0x10 + lVar3 * 8));
      lVar3 = lVar3 + -1;
    } while (iVar2 != 0);
    if (0 < lVar3) {
      getChildNode(this,(int)name);
      return (XMLNode)(XMLNodeData *)this;
    }
  }
LAB_0017bdd9:
  XMLNode(this,(XMLNode *)&emptyXMLNode);
  return (XMLNode)(XMLNodeData *)this;
}

Assistant:

XMLNode XMLNode::getChildNode(XMLCSTR name, int j) const
    {
        if(!d)
            return emptyXMLNode;
        if(j >= 0)
        {
            int i = 0;
            while(j-- > 0)
                getChildNode(name, &i);
            return getChildNode(name, &i);
        }
        int i = d->nChild;
        while(i--)
            if(!xstricmp(name, d->pChild[i].d->lpszName))
                break;
        if(i < 0)
            return emptyXMLNode;
        return getChildNode(i);
    }